

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat3 *matrixArray,size_t length)

{
  GLfloat *pGVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&contiguous,length * 9,(allocator_type *)&binder);
  lVar3 = 0;
  sVar2 = length;
  while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
    priv::copyMatrix((float *)(matrixArray + lVar3),9,
                     (float *)((long)contiguous.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x24;
  }
  UniformBinder::UniformBinder(&binder,this,name);
  if (binder.location != -1) {
    pGVar1 = (GLfloat *)0x0;
    if (contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pGVar1 = contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniformMatrix3fvARB)(binder.location,(GLsizei)length,'\0',pGVar1);
  }
  UniformBinder::~UniformBinder(&binder);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&contiguous.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat3* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 3 * 3;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, !contiguous.empty() ? &contiguous[0] : NULL));
}